

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::ExtensionQueryCase::iterate(ExtensionQueryCase *this)

{
  size_type *psVar1;
  _Alloc_hider _Var2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  char *pcVar6;
  size_type sVar7;
  iterator iVar8;
  size_type sVar9;
  ulong uVar10;
  pointer pbVar11;
  long lVar12;
  size_type sVar13;
  ulong uVar14;
  bool bVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonIndexedExts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  indexedExts;
  string extensionStr;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pcVar6 = (char *)(**(code **)(lVar5 + 0xa78))(0x1f03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extensionStr,pcVar6,(allocator<char> *)&indexedExts);
  nonIndexedExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nonIndexedExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nonIndexedExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar13 = 0;
  do {
    sVar7 = std::__cxx11::string::find((char)&extensionStr,0x20);
    sVar9 = sVar7;
    if (sVar7 == 0xffffffffffffffff) {
      sVar9 = extensionStr._M_string_length;
    }
    if (sVar9 != sVar13) {
      std::__cxx11::string::substr((ulong)&indexedExts,(ulong)&extensionStr);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &nonIndexedExts,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&indexedExts);
      std::__cxx11::string::~string((string *)&indexedExts);
    }
    sVar13 = sVar7 + 1;
  } while (sVar13 != 0);
  std::__cxx11::string::~string((string *)&extensionStr);
  extensionStr._M_dataplus._M_p._0_4_ = 0xffffffff;
  (**(code **)(lVar5 + 0x868))(0x821d,&extensionStr);
  _Var2 = extensionStr._M_dataplus;
  iVar3 = (int)extensionStr._M_dataplus._M_p;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&indexedExts,(long)(int)extensionStr._M_dataplus._M_p,(allocator_type *)&extensionStr);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GL_NUM_EXTENSIONS query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fImplementationLimitTests.cpp"
                  ,0x162);
  uVar14 = 0;
  uVar10 = (ulong)_Var2._M_p & 0xffffffff;
  if (iVar3 < 1) {
    uVar10 = uVar14;
  }
  for (lVar12 = 0; uVar10 * 0x20 != lVar12; lVar12 = lVar12 + 0x20) {
    (**(code **)(lVar5 + 0xa80))(0x1f03,uVar14);
    std::__cxx11::string::assign
              ((char *)((long)&((indexedExts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar12));
    uVar14 = (ulong)((int)uVar14 + 1);
  }
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGetStringi(GL_EXTENSIONS) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fImplementationLimitTests.cpp"
                  ,0x167);
  if ((long)nonIndexedExts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)nonIndexedExts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)indexedExts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)indexedExts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&extensionStr,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )indexedExts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )indexedExts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    pbVar11 = nonIndexedExts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar15 = pbVar11 ==
               nonIndexedExts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar15) break;
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&extensionStr,pbVar11);
      pbVar11 = pbVar11 + 1;
    } while (iVar8._M_node != (_Base_ptr)&extensionStr._M_string_length);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&extensionStr);
  }
  else {
    bVar15 = false;
  }
  extensionStr._M_dataplus._M_p =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  psVar1 = &extensionStr._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
  std::operator<<((ostream *)psVar1,"Extensions as reported by glGetStringi(GL_EXTENSIONS):");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&extensionStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  psVar1 = &extensionStr._M_string_length;
  for (pbVar11 = indexedExts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar11 !=
      indexedExts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
    extensionStr._M_dataplus._M_p =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,(string *)pbVar11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  }
  if (bVar15 == false) {
    extensionStr._M_dataplus._M_p =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    psVar1 = &extensionStr._M_string_length;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"Extensions as reported by glGetString(GL_EXTENSIONS):");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
    psVar1 = &extensionStr._M_string_length;
    for (pbVar11 = nonIndexedExts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 !=
        nonIndexedExts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
      extensionStr._M_dataplus._M_p =
           (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
      std::operator<<((ostream *)psVar1,(string *)pbVar11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&extensionStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
    }
    extensionStr._M_dataplus._M_p =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    psVar1 = &extensionStr._M_string_length;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"ERROR: Extension lists do not match!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
    pcVar6 = "Invalid extension list";
  }
  else {
    pcVar6 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar15 ^ 1),
             pcVar6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&indexedExts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&nonIndexedExts);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
		const vector<string>	nonIndexedExts		= queryExtensionsNonIndexed(gl);
		const vector<string>	indexedExts			= queryExtensionsIndexed(gl);
		const bool				isOk				= compareExtensionLists(nonIndexedExts, indexedExts);

		m_testCtx.getLog() << TestLog::Message << "Extensions as reported by glGetStringi(GL_EXTENSIONS):" << TestLog::EndMessage;
		for (vector<string>::const_iterator ext = indexedExts.begin(); ext != indexedExts.end(); ++ext)
			m_testCtx.getLog() << TestLog::Message << *ext << TestLog::EndMessage;

		if (!isOk)
		{
			m_testCtx.getLog() << TestLog::Message << "Extensions as reported by glGetString(GL_EXTENSIONS):" << TestLog::EndMessage;
			for (vector<string>::const_iterator ext = nonIndexedExts.begin(); ext != nonIndexedExts.end(); ++ext)
				m_testCtx.getLog() << TestLog::Message << *ext << TestLog::EndMessage;

			m_testCtx.getLog() << TestLog::Message << "ERROR: Extension lists do not match!" << TestLog::EndMessage;
		}

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Invalid extension list");
		return STOP;
	}